

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

bool __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::acceptVisitor
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,VisitorVariant *visitor)

{
  bool bVar1;
  DynamicStringPairView *pDVar2;
  DynamicStringPairView *view;
  VisitorVariant *visitor_local;
  Property<Protocol::MQTT::Common::DynamicStringPair> *this_local;
  
  bVar1 = PropertyBase::acceptVisitor(&this->super_PropertyBase,visitor);
  if (bVar1) {
    pDVar2 = VisitorVariant::as<Protocol::MQTT::Common::DynamicStringPairView>(visitor);
    if (pDVar2 == (DynamicStringPairView *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      Common::DynamicStringView::operator=(&pDVar2->key,(DynamicString *)&this->field_0x21);
      Common::DynamicStringView::operator=(&pDVar2->value,(DynamicString *)&this->field_0x33);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool acceptVisitor(VisitorVariant & visitor) const
                {
                    if (!PropertyBase::acceptVisitor(visitor)) return false;
                    DynamicStringPairView * view = visitor.as<DynamicStringPairView>();
                    if (!view) return false;
                    view->key = value.key;
                    view->value = value.value;
                    return true;
                }